

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
rc::detail::(anonymous_namespace)::describeIngredient_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Ingredient *ingredient)

{
  pointer *__ptr;
  string description;
  ostringstream valueString;
  __uniq_ptr_impl<rc::detail::Any::IAnyImpl,_std::default_delete<rc::detail::Any::IAnyImpl>_>
  local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [376];
  
  (**(code **)**(undefined8 **)(this + 0x20))(&local_1d8);
  std::__cxx11::string::string((string *)&local_1b0,(string *)this);
  if (local_1b0._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    Any::showType((Any *)&local_1d8,(ostream *)local_190);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  Any::showValue((Any *)&local_1d8,(ostream *)local_190);
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,&local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  if (local_1d8._M_t.
      super__Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
      .super__Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
       )0x0) {
    (*(*(_func_int ***)
        local_1d8._M_t.
        super__Tuple_impl<0UL,_rc::detail::Any::IAnyImpl_*,_std::default_delete<rc::detail::Any::IAnyImpl>_>
        .super__Head_base<0UL,_rc::detail::Any::IAnyImpl_*,_false>._M_head_impl)[5])();
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string>
describeIngredient(const gen::detail::Recipe::Ingredient &ingredient) {
  // TODO I don't know if this is the right approach with counterexamples
  // even...
  try {
    return tryDescribeIngredientValue(ingredient);
  } catch (const GenerationFailure &e) {
    return {"Generation failed", e.what()};
  } catch (const std::exception &e) {
    return {"Exception while generating", e.what()};
  } catch (...) {
    return {"Unknown exception", "<\?\?\?>"};
  }
}